

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restore.c
# Opt level: O2

int dorecover_fd(int infd)

{
  int iVar1;
  __off_t __offset;
  int iVar2;
  memfile mf;
  
  mnew(&mf,(memfile *)0x0);
  restoring = '\x01';
  __offset = lseek(infd,0,1);
  mf.buf = loadfile(infd,&mf.len);
  iVar2 = 0;
  if (mf.buf != (char *)0x0) {
    iVar1 = dorecover(&mf);
    mfree(&mf);
    if (iVar1 != 0) {
      lseek(infd,__offset,0);
      ftruncate(infd,__offset);
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int dorecover_fd(int infd)
{
	int ret;
	struct memfile mf;
	long initial_pos;

	mnew(&mf, NULL);

	restoring = TRUE;

	initial_pos = lseek(infd, 0, SEEK_CUR);
	mf.buf = loadfile(infd, &mf.len);
	if (!mf.buf)
	    return 0;
	
	ret = dorecover(&mf);
	mfree(&mf);
	
	if (ret) {
	    /* erase the binary portion of the logfile */
	    lseek(infd, initial_pos, SEEK_SET);
	    ftruncate(infd, initial_pos);
	}
	
	return ret;
}